

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTupleArray<unsigned_long,2ul>
          (AsciiParser *this,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_2UL>_>_>_>
          *result)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  char c;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  bVar2 = Expect(this,'[');
  if (!bVar2) {
    return false;
  }
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar2) {
    return false;
  }
  bVar2 = Char1(this,&local_11);
  if (bVar2) {
    if (local_11 != ']') {
      bVar2 = Rewind(this,1);
      bVar1 = true;
      goto LAB_00432375;
    }
    bVar2 = true;
    if (*(long *)(result + 8) != *(long *)result) {
      *(long *)(result + 8) = *(long *)result;
    }
  }
  else {
    bVar2 = false;
  }
  bVar1 = false;
LAB_00432375:
  if (!bVar1) {
    return bVar2;
  }
  bVar2 = SepBy1TupleType<unsigned_long,2ul>(this,',',result);
  if (!bVar2) {
    return false;
  }
  bVar2 = Expect(this,']');
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTupleArray(
    std::vector<nonstd::optional<std::array<T, N>>> *result) {

  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1TupleType<T, N>(',', result)) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }

  return true;
}